

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

bool Js::JavascriptOperators::PatchInitValueCantChangeType<Js::InlineCache>
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,RecyclableObject *object,PropertyId propertyId,
               Var newValue)

{
  bool bVar1;
  DynamicObject *pDVar2;
  Type *pTVar3;
  
  bVar1 = VarIsImpl<Js::DynamicObject>(object);
  if (bVar1) {
    pDVar2 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(object);
    pTVar3 = (pDVar2->super_RecyclableObject).type.ptr;
  }
  else {
    pTVar3 = (Type *)0x0;
  }
  PatchInitValue<true,Js::InlineCache>
            (functionBody,inlineCache,inlineCacheIndex,object,propertyId,newValue);
  if (pTVar3 == (Type *)0x0) {
    bVar1 = false;
  }
  else {
    pDVar2 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(object);
    bVar1 = pTVar3 != (pDVar2->super_RecyclableObject).type.ptr;
  }
  return bVar1;
}

Assistant:

inline bool JavascriptOperators::PatchInitValueCantChangeType(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, RecyclableObject* object, PropertyId propertyId, Var newValue)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchInitValueCantChangeType);
        JIT_HELPER_SAME_ATTRIBUTES(Op_PatchInitValueCantChangeType, Op_PatchInitValue);

        Type * oldType = VarIs<DynamicObject>(object) ? UnsafeVarTo<DynamicObject>(object)->GetType() : nullptr;
        PatchInitValue<true, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, object, propertyId, newValue);
        return (oldType != nullptr && oldType != UnsafeVarTo<DynamicObject>(object)->GetType());

        JIT_HELPER_END(Op_PatchInitValueCantChangeType);
    }